

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

Descriptor * __thiscall
google::protobuf::FileDescriptor::FindMessageTypeByName(FileDescriptor *this,string *key)

{
  long lVar1;
  ulong uVar2;
  char *__s1;
  char cVar3;
  int iVar4;
  Descriptor *pDVar5;
  long lVar6;
  long *plVar7;
  long *plVar8;
  char *pcVar9;
  long *plVar10;
  
  lVar1 = *(long *)(*(long *)(this + 0x90) + 8);
  uVar2 = *(ulong *)(*(long *)(this + 0x90) + 0x10);
  __s1 = (key->_M_dataplus)._M_p;
  cVar3 = *__s1;
  if (cVar3 == '\0') {
    lVar6 = 0;
  }
  else {
    lVar6 = 0;
    pcVar9 = __s1;
    do {
      pcVar9 = pcVar9 + 1;
      lVar6 = (long)cVar3 + lVar6 * 5;
      cVar3 = *pcVar9;
    } while (cVar3 != '\0');
  }
  plVar10 = *(long **)(lVar1 + ((ulong)((long)this * 0xffff + lVar6) % uVar2) * 8);
  do {
    if (plVar10 == (long *)0x0) {
      plVar7 = *(long **)(lVar1 + uVar2 * 8);
      plVar10 = plVar7;
LAB_001cbbd3:
      plVar8 = plVar10 + 2;
      if (plVar10 == plVar7) {
        plVar8 = (long *)&(anonymous_namespace)::kNullSymbol;
      }
      pDVar5 = (Descriptor *)0x0;
      if ((anonymous_namespace)::kNullSymbol != 0) {
        pDVar5 = DAT_002925f8;
      }
      if ((int)*plVar8 == 1) {
        pDVar5 = (Descriptor *)plVar8[1];
      }
      return pDVar5;
    }
    if (((FileDescriptor *)*plVar10 == this) &&
       (iVar4 = strcmp(__s1,(char *)plVar10[1]), iVar4 == 0)) {
      plVar7 = *(long **)(lVar1 + uVar2 * 8);
      goto LAB_001cbbd3;
    }
    plVar10 = (long *)plVar10[4];
  } while( true );
}

Assistant:

const Descriptor*
FileDescriptor::FindMessageTypeByName(const string& key) const {
  Symbol result = tables_->FindNestedSymbolOfType(this, key, Symbol::MESSAGE);
  if (!result.IsNull()) {
    return result.descriptor;
  } else {
    return NULL;
  }
}